

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GrcManager::MinAndMaxGlyphAttrValues
          (GrcManager *this,int nAttrID,int cJLevels,int nAttrIdJStr,int nAttrIdJShr,
          int nAttrIdJStep,int nAttrIdJWeight,int nAttrIdSkipPasses,int *pnMin,int *pnMax)

{
  *pnMin = -0x8000;
  *pnMax = 0x8000;
  if (nAttrID < nAttrIdJStr + cJLevels && nAttrIdJStr <= nAttrID) {
    *pnMin = -1;
    *pnMax = 0x40000000;
    return;
  }
  if ((nAttrIdJShr + cJLevels <= nAttrID || nAttrID < nAttrIdJShr) &&
     (nAttrIdJStep + cJLevels <= nAttrID || nAttrID < nAttrIdJStep)) {
    if (nAttrID < cJLevels + nAttrIdJWeight && nAttrIdJWeight <= nAttrID) {
      *pnMin = 0;
      *pnMax = 0xff;
      return;
    }
    if (nAttrIdSkipPasses == nAttrID) {
      *pnMin = -1;
      *pnMax = 0x10000;
    }
    return;
  }
  *pnMin = -1;
  return;
}

Assistant:

void GrcManager::MinAndMaxGlyphAttrValues(int nAttrID,
	int cJLevels, int nAttrIdJStr, int nAttrIdJShr, int nAttrIdJStep, int nAttrIdJWeight,
	int nAttrIdSkipPasses,
	int * pnMin, int * pnMax)
{
	*pnMin = kMinGlyphAttrValue;
	*pnMax = kMaxGlyphAttrValue;
	if (nAttrIdJStr <= nAttrID && nAttrID < nAttrIdJStr + cJLevels)
	{
		//	justify.stretch
		*pnMin = -1;
		*pnMax = 0x40000000;
	}
	else if (nAttrIdJShr <= nAttrID && nAttrID < nAttrIdJShr + cJLevels)
	{
		//	justify.shrink
		*pnMin = -1;
	}
	else if (nAttrIdJStep <= nAttrID && nAttrID < nAttrIdJStep + cJLevels)
	{
		//	justify.step
		*pnMin = -1;
	}
	else if (nAttrIdJWeight <= nAttrID && nAttrID < nAttrIdJWeight + cJLevels)
	{
		//	justify.weight
		*pnMin = 0;
		*pnMax = 255;
	}
	else if (nAttrIdSkipPasses == nAttrID)
	{
		*pnMin = -1;
		*pnMax = 0x10000; // 1 + actual max=0xFFFF (since test is >= )
	}
}